

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_dermixfrac(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                      Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  Real RVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  GpuArray<double,_9U> *pGVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  double *pdVar30;
  int iVar31;
  int n_1;
  long lVar32;
  double *pdVar33;
  byte bVar34;
  double dVar35;
  double dVar36;
  GpuArray<double,_9U> fact_lcl;
  double local_88 [9];
  Real local_40;
  double local_38;
  
  bVar34 = 0;
  if (!PeleLM::mixture_fraction_ready) {
    amrex::Abort_host("Mixture fraction not initialized");
  }
  RVar12 = PeleLM::Zox;
  pdVar10 = (datfab->super_BaseFab<double>).dptr;
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar26 = (long)iVar2;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar31 = (datfab->super_BaseFab<double>).domain.bigend.vect[0] + 1;
  iVar13 = (datfab->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  lVar28 = (long)(iVar31 - iVar2);
  lVar27 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar3) + 1);
  lVar17 = lVar27 * lVar28;
  pdVar11 = (derfab->super_BaseFab<double>).dptr;
  lVar22 = (long)(derfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar21 = (long)(derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar2 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar5 = (derfab->super_BaseFab<double>).domain.bigend.vect[1];
  lVar18 = ((derfab->super_BaseFab<double>).domain.bigend.vect[0] - lVar22) + 1;
  for (lVar19 = 0; lVar19 != 9; lVar19 = lVar19 + 1) {
    fact_lcl.arr[lVar19] = PeleLM::spec_Bilger_fact._M_elems[lVar19];
  }
  dVar35 = 1.0 / (PeleLM::Zfu - PeleLM::Zox);
  pGVar23 = &fact_lcl;
  pdVar29 = local_88;
  for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
    *pdVar29 = pGVar23->arr[0];
    pGVar23 = (GpuArray<double,_9U> *)((long)pGVar23 + ((ulong)bVar34 * -2 + 1) * 8);
    pdVar29 = pdVar29 + (ulong)bVar34 * -2 + 1;
  }
  local_40 = PeleLM::Zox;
  local_38 = dVar35;
  iVar6 = (bx->smallend).vect[0];
  lVar19 = (long)(bx->smallend).vect[1];
  lVar24 = (long)(bx->smallend).vect[2];
  iVar7 = (bx->bigend).vect[0];
  iVar8 = (bx->bigend).vect[1];
  iVar9 = (bx->bigend).vect[2];
  pdVar29 = (double *)
            ((((long)iVar13 * 8 + lVar24 * 8 + (long)iVar4 * -0x10) * lVar27 + lVar19 * 8 +
             (long)iVar3 * -8) * lVar28 + (long)iVar6 * 8 + lVar26 * -8 + (long)pdVar10);
  for (; lVar24 <= iVar9; lVar24 = lVar24 + 1) {
    lVar14 = (lVar24 - iVar2) * ((iVar5 - lVar21) + 1) * lVar18;
    pdVar30 = pdVar29;
    for (lVar27 = lVar19; lVar27 <= iVar8; lVar27 = lVar27 + 1) {
      if (iVar6 <= iVar7) {
        lVar15 = (lVar27 - lVar21) * lVar18;
        lVar16 = (long)iVar6;
        pdVar33 = pdVar30;
        do {
          dVar1 = pdVar10[(lVar24 - iVar4) * lVar17 + (lVar27 - iVar3) * lVar28 + (lVar16 - lVar26)]
          ;
          lVar20 = lVar16 - lVar22;
          pdVar11[lVar14 + lVar15 + lVar20] = 0.0;
          dVar36 = 0.0;
          pdVar25 = pdVar33;
          for (lVar32 = 0; lVar32 != 9; lVar32 = lVar32 + 1) {
            dVar36 = dVar36 + *pdVar25 * local_88[lVar32] * (1.0 / dVar1);
            pdVar11[lVar14 + lVar15 + lVar20] = dVar36;
            pdVar25 = pdVar25 + (iVar13 - iVar4) * lVar17;
          }
          pdVar11[lVar14 + lVar15 + lVar20] = (dVar36 - RVar12) * dVar35;
          lVar16 = lVar16 + 1;
          pdVar33 = pdVar33 + 1;
        } while (iVar7 + 1 != (int)lVar16);
      }
      pdVar30 = pdVar30 + (iVar31 - lVar26);
    }
    pdVar29 = pdVar29 + lVar17;
  }
  return;
}

Assistant:

void pelelm_dermixfrac (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == 1);

    if (!PeleLM::mixture_fraction_ready) amrex::Abort("Mixture fraction not initialized");

    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto       mixt_frac = derfab.array(0);

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx,
    [density, rhoY, mixt_frac, fact_lcl, Zox_lcl, denom_inv] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
    });
}